

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O1

void __thiscall
duckdb::PipelineExecutor::PipelineExecutor
          (PipelineExecutor *this,ClientContext *context_p,Pipeline *pipeline_p)

{
  unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> *this_00;
  PhysicalOperator *pPVar1;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var2;
  pointer puVar3;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var4;
  PhysicalOperator *pPVar5;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var6;
  int iVar7;
  pointer pLVar8;
  idx_t index;
  type pGVar9;
  optional_ptr<duckdb::PhysicalOperator,_true> *poVar10;
  reference pvVar11;
  DataChunk *this_01;
  pointer this_02;
  Allocator *allocator;
  pointer pGVar12;
  size_type __n;
  Pipeline *pPVar13;
  pointer *__ptr;
  templated_unique_single_t chunk;
  unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true> op_state;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> local_88;
  pointer local_80;
  pointer puStack_78;
  pointer local_70;
  ExecutionContext *local_68;
  vector<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>>
  *local_60;
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  *local_58;
  _Head_base<0UL,_duckdb::OperatorState_*,_false> local_50;
  DataChunk *local_48;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *local_40;
  InterruptState *local_38;
  
  this->pipeline = pipeline_p;
  ThreadContext::ThreadContext(&this->thread,context_p);
  (this->context).client = context_p;
  (this->context).thread = &this->thread;
  (this->context).pipeline.ptr = pipeline_p;
  local_58 = (vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
              *)&this->intermediate_chunks;
  local_60 = (vector<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>>
              *)&this->intermediate_states;
  this_00 = &this->local_sink_state;
  local_38 = &this->interrupt_state;
  (this->intermediate_chunks).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intermediate_chunks).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intermediate_chunks).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->intermediate_states).
  super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intermediate_states).
  super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intermediate_states).
  super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->local_source_state).
  super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
  .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl = (LocalSourceState *)0x0;
  (this->local_sink_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)0x0;
  InterruptState::InterruptState(local_38);
  local_48 = &this->final_chunk;
  DataChunk::DataChunk(local_48);
  local_40 = &this->in_process_operators;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,0);
  local_68 = &this->context;
  this->finalized = false;
  this->finished_processing_idx = -1;
  (this->required_partition_info).batch_index = false;
  (this->required_partition_info).partition_columns.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->required_partition_info).partition_columns.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->required_partition_info).partition_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->required_partition_info).partition_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  this->should_flush_current_idx = true;
  if ((this->pipeline->sink).ptr != (PhysicalOperator *)0x0) {
    poVar10 = &this->pipeline->sink;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar10);
    pPVar1 = poVar10->ptr;
    (*pPVar1->_vptr_PhysicalOperator[0x1f])(&local_88,pPVar1,local_68);
    _Var6._M_head_impl = local_88._M_head_impl;
    local_88._M_head_impl = (LocalSinkState *)0x0;
    _Var2._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
         .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
    super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var2._M_head_impl != (LocalSinkState *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_LocalSinkState + 8))();
    }
    if (local_88._M_head_impl != (LocalSinkState *)0x0) {
      (*(local_88._M_head_impl)->_vptr_LocalSinkState[1])();
    }
    poVar10 = &this->pipeline->sink;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar10);
    (*poVar10->ptr->_vptr_PhysicalOperator[0x23])(&local_88);
    (this->required_partition_info).batch_index = local_88._M_head_impl._0_1_;
    puVar3 = (this->required_partition_info).partition_columns.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->required_partition_info).partition_columns.
    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = local_80;
    (this->required_partition_info).partition_columns.
    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_78;
    (this->required_partition_info).partition_columns.
    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_70;
    local_80 = (pointer)0x0;
    puStack_78 = (pointer)0x0;
    local_70 = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    if (local_80 != (pointer)0x0) {
      operator_delete(local_80);
    }
    if (((this->required_partition_info).partition_columns.
         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (this->required_partition_info).partition_columns.
         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       (((this->required_partition_info).batch_index & 1U) != 0)) {
      pLVar8 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
               ::operator->(this_00);
      index = Pipeline::RegisterNewBatchIndex(this->pipeline);
      optional_idx::optional_idx((optional_idx *)&local_88,index);
      (pLVar8->partition_info).batch_index.index = (idx_t)local_88._M_head_impl;
      (pLVar8->partition_info).min_batch_index.index = (idx_t)local_88._M_head_impl;
    }
  }
  poVar10 = &this->pipeline->source;
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar10);
  pPVar1 = poVar10->ptr;
  pGVar9 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
           ::operator*(&this->pipeline->source_state);
  (*pPVar1->_vptr_PhysicalOperator[0xf])(&local_88,pPVar1,local_68,pGVar9);
  _Var2._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (LocalSinkState *)0x0;
  _Var4._M_head_impl =
       (this->local_source_state).
       super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
       .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
  (this->local_source_state).
  super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
  .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl =
       (LocalSourceState *)_Var2._M_head_impl;
  if (_Var4._M_head_impl != (LocalSourceState *)0x0) {
    (*(_Var4._M_head_impl)->_vptr_LocalSourceState[1])();
  }
  if ((DataChunk *)local_88._M_head_impl != (DataChunk *)0x0) {
    (**(code **)((long)(((vector<duckdb::Vector,_true> *)
                        &(local_88._M_head_impl)->_vptr_LocalSinkState)->
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>).
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_start + 8))();
  }
  std::
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ::reserve(local_58,(long)(this->pipeline->operators).
                           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                           .
                           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->pipeline->operators).
                           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                           .
                           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  ::std::
  vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
             *)local_60,
            (long)(this->pipeline->operators).
                  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->pipeline->operators).
                  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  pPVar13 = this->pipeline;
  if ((pPVar13->operators).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pPVar13->operators).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (__n == 0) {
        poVar10 = &pPVar13->source;
        optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar10);
      }
      else {
        poVar10 = (optional_ptr<duckdb::PhysicalOperator,_true> *)
                  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                            (&pPVar13->operators,__n - 1);
      }
      pPVar1 = poVar10->ptr;
      pvVar11 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                          (&this->pipeline->operators,__n);
      pPVar5 = pvVar11->_M_data;
      this_01 = (DataChunk *)operator_new(0x40);
      DataChunk::DataChunk(this_01);
      local_88._M_head_impl = (LocalSinkState *)this_01;
      this_02 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                            *)&local_88);
      allocator = Allocator::Get(local_68->client);
      DataChunk::Initialize(this_02,allocator,&pPVar1->types,0x800);
      ::std::
      vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
                ((vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                  *)local_58,
                 (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 &local_88);
      (*pPVar5->_vptr_PhysicalOperator[8])(&local_50,pPVar5,local_68);
      ::std::
      vector<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>
                (local_60,(unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                           *)&local_50);
      iVar7 = (*pPVar5->_vptr_PhysicalOperator[0x21])(pPVar5);
      if ((char)iVar7 != '\0') {
        pGVar12 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                  ::operator->(&pPVar5->sink_state);
        if (pGVar12->state == NO_OUTPUT_POSSIBLE) {
          FinishProcessing(this,-1);
        }
      }
      if (local_50._M_head_impl != (OperatorState *)0x0) {
        (*(local_50._M_head_impl)->_vptr_OperatorState[1])();
      }
      _Var2._M_head_impl = local_88._M_head_impl;
      if ((DataChunk *)local_88._M_head_impl != (DataChunk *)0x0) {
        DataChunk::~DataChunk((DataChunk *)local_88._M_head_impl);
        operator_delete(_Var2._M_head_impl);
      }
      __n = __n + 1;
      pPVar13 = this->pipeline;
    } while (__n < (ulong)((long)(pPVar13->operators).
                                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pPVar13->operators).
                                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  InitializeChunk(this,local_48);
  return;
}

Assistant:

PipelineExecutor::PipelineExecutor(ClientContext &context_p, Pipeline &pipeline_p)
    : pipeline(pipeline_p), thread(context_p), context(context_p, thread, &pipeline_p) {
	D_ASSERT(pipeline.source_state);
	if (pipeline.sink) {
		local_sink_state = pipeline.sink->GetLocalSinkState(context);
		required_partition_info = pipeline.sink->RequiredPartitionInfo();
		if (required_partition_info.AnyRequired()) {
			D_ASSERT(pipeline.source->SupportsPartitioning(OperatorPartitionInfo::BatchIndex()));
			auto &partition_info = local_sink_state->partition_info;
			D_ASSERT(!partition_info.batch_index.IsValid());
			// batch index is not set yet - initialize before fetching anything
			partition_info.batch_index = pipeline.RegisterNewBatchIndex();
			partition_info.min_batch_index = partition_info.batch_index;
		}
	}
	local_source_state = pipeline.source->GetLocalSourceState(context, *pipeline.source_state);

	intermediate_chunks.reserve(pipeline.operators.size());
	intermediate_states.reserve(pipeline.operators.size());
	for (idx_t i = 0; i < pipeline.operators.size(); i++) {
		auto &prev_operator = i == 0 ? *pipeline.source : pipeline.operators[i - 1].get();
		auto &current_operator = pipeline.operators[i].get();

		auto chunk = make_uniq<DataChunk>();
		chunk->Initialize(Allocator::Get(context.client), prev_operator.GetTypes());
		intermediate_chunks.push_back(std::move(chunk));

		auto op_state = current_operator.GetOperatorState(context);
		intermediate_states.push_back(std::move(op_state));

		if (current_operator.IsSink() && current_operator.sink_state->state == SinkFinalizeType::NO_OUTPUT_POSSIBLE) {
			// one of the operators has already figured out no output is possible
			// we can skip executing the pipeline
			FinishProcessing();
		}
	}
	InitializeChunk(final_chunk);
}